

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordCopyApplet.cpp
# Opt level: O3

void __thiscall WordCopyApplet::WordCopyApplet(WordCopyApplet *this,Samba *samba,uint32_t addr)

{
  Applet::Applet(&this->super_Applet,samba,addr,applet.code,0x34,applet.start + addr,
                 applet.stack + addr,applet.reset + addr);
  (this->super_Applet)._vptr_Applet = (_func_int **)&PTR__WordCopyApplet_001185c8;
  return;
}

Assistant:

WordCopyApplet::WordCopyApplet(Samba& samba, uint32_t addr)
    : Applet(samba,
             addr,
             applet.code,
             sizeof(applet.code),
             addr + applet.start,
             addr + applet.stack,
             addr + applet.reset)
{
}